

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  ReadFileResult result;
  int iVar3;
  string *psVar4;
  iterator iVar5;
  _Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *this_00;
  pointer pCVar6;
  ConfigurePreset *pCVar7;
  TestPreset *pTVar8;
  PackagePreset *pPVar9;
  BuildPreset *pBVar10;
  ostream *poVar11;
  undefined4 extraout_var;
  bool bVar12;
  _Tp_alloc_type *__alloc;
  WorkflowStep *pWVar13;
  size_t __n;
  long lVar14;
  char *this_01;
  WorkflowStep *step;
  pointer pCVar16;
  static_string_view type;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view type_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  static_string_view type_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  static_string_view type_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator_type local_30e;
  allocator<char> local_30d;
  int stepNumber;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  allocator_type local_2e1;
  WorkflowStep *local_2e0;
  undefined8 local_2d8;
  static_string_view local_2d0;
  static_string_view local_2b8;
  WorkflowFresh local_2a4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  cmCMakePresetsGraph settingsFile;
  cmake *pcVar15;
  
  local_2a4 = fresh;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&settingsFile.errors);
  std::__cxx11::string::~string((string *)&settingsFile);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&settingsFile.errors);
  std::__cxx11::string::~string((string *)&settingsFile);
  settingsFile.errors._M_dataplus._M_p = (pointer)&settingsFile.errors.field_2;
  settingsFile.errors._M_string_length = 0;
  settingsFile.errors.field_2._M_local_buf[0] = '\0';
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.SourceDir._M_dataplus._M_p = (pointer)&settingsFile.SourceDir.field_2;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.SourceDir._M_string_length = 0;
  settingsFile.SourceDir.field_2._M_local_buf[0] = '\0';
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  psVar4 = GetHomeDirectory_abi_cxx11_(this);
  result = cmCMakePresetsGraph::ReadProjectPresets(&settingsFile,psVar4,false);
  local_2d8 = 1;
  if (result == READ_OK) {
    if (listPresets == Yes) {
      local_2d8 = 0;
      cmCMakePresetsGraph::PrintWorkflowPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
    }
    else {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
              ::find(&settingsFile.WorkflowPresets._M_t,presetName);
      if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
        local_270._0_8_ = &DAT_0000001b;
        local_270._8_8_ = "No such workflow preset in ";
        psVar4 = GetHomeDirectory_abi_cxx11_(this);
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar4->_M_dataplus)._M_p;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar4->_M_string_length;
        local_2d0.super_string_view._M_len = CONCAT71(local_2d0.super_string_view._M_len._1_7_,0x22)
        ;
        cmStrCat<char[4],std::__cxx11::string,char>
                  ((string *)&steps,(cmAlphaNum *)local_270,(cmAlphaNum *)&args,
                   (char (*) [4])0x67336c,presetName,(char *)&local_2d0);
        cmSystemTools::Error((string *)&steps);
      }
      else {
        if ((char)iVar5._M_node[4]._M_color != _S_black) {
          if ((char)iVar5._M_node[0x11]._M_color == _S_red) {
            local_270._0_8_ = (pointer)0x24;
            local_270._8_8_ = "Could not evaluate workflow preset \"";
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(presetName->_M_dataplus)._M_p;
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)presetName->_M_string_length;
            cmStrCat<char[27]>((string *)&steps,(cmAlphaNum *)local_270,(cmAlphaNum *)&args,
                               (char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error((string *)&steps);
          }
          else {
            if (*(char *)&iVar5._M_node[0xe]._M_left != '\0') {
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              step = (WorkflowStep *)iVar5._M_node[0x10]._M_parent;
              local_2e0 = (WorkflowStep *)iVar5._M_node[0x10]._M_left;
              __alloc = (_Tp_alloc_type *)&DAT_00000028;
              this_00 = (_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                        (((long)local_2e0 - (long)step) / 0x28);
              if ((_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *)0x1745d1745d1745d
                  < this_00) {
                std::__throw_length_error("vector::reserve");
              }
              if (local_2e0 != step) {
                pCVar6 = std::_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>::
                         _M_allocate(this_00,(size_t)local_2e0);
                std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::_S_relocate
                          ((pointer)0x0,(pointer)0x0,pCVar6,__alloc);
                std::_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>::_M_deallocate
                          ((_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *)0x0,
                           (pointer)0x0,__n);
                steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pCVar6 + (long)this_00;
                step = (WorkflowStep *)iVar5._M_node[0x10]._M_parent;
                local_2e0 = (WorkflowStep *)iVar5._M_node[0x10]._M_left;
                steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
                super__Vector_impl_data._M_finish = pCVar6;
              }
              stepNumber = 1;
              local_2d8 = 1;
              pWVar13 = local_2e0;
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_start =
                   steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              for (; pCVar6 = steps.
                              super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>.
                              _M_impl.super__Vector_impl_data._M_finish, step != pWVar13;
                  step = step + 1) {
                switch(step->PresetType) {
                case Configure:
                  type.super_string_view._M_str = "configure";
                  type.super_string_view._M_len = 9;
                  pCVar7 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                     (this,type,&settingsFile.ConfigurePresets,step);
                  uVar2 = local_2d8;
                  if (pCVar7 == (ConfigurePreset *)0x0) goto LAB_001e5820;
                  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_270,(string *)psVar4);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_250,"--preset",(allocator<char> *)&local_2d0);
                  std::__cxx11::string::string(local_230,(string *)&step->PresetName);
                  this_01 = local_270;
                  __l._M_len = 3;
                  __l._M_array = (iterator)this_01;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&args,__l,(allocator_type *)&local_2b8);
                  lVar14 = 0x40;
                  do {
                    std::__cxx11::string::~string((string *)(local_270 + lVar14));
                    lVar14 = lVar14 + -0x20;
                  } while (lVar14 != -0x20);
                  if (local_2a4 == Yes) {
                    this_01 = "--fresh";
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[8]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &args,(char (*) [8])"--fresh");
                  }
                  local_2d0.super_string_view._M_len = (size_t)&DAT_00000009;
                  local_2d0.super_string_view._M_str = "configure";
                  BuildWorkflowStep((function<int_()> *)local_270,(cmake *)this_01,&args);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_2d0,&step->PresetName,
                             (function<int_()> *)local_270);
                  std::_Function_base::~_Function_base((_Function_base *)local_270);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&args);
                  pWVar13 = local_2e0;
                  break;
                case Build:
                  type_02.super_string_view._M_str = "build";
                  type_02.super_string_view._M_len = 5;
                  pBVar10 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                      (this,type_02,&settingsFile.BuildPresets,step);
                  uVar2 = local_2d8;
                  if (pBVar10 == (BuildPreset *)0x0) goto LAB_001e5820;
                  local_2b8.super_string_view._M_len = 5;
                  local_2b8.super_string_view._M_str = "build";
                  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_270,(string *)psVar4);
                  std::__cxx11::string::string<std::allocator<char>>(local_250,"--build",&local_30d)
                  ;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_230,"--preset",(allocator<char> *)&local_30e);
                  std::__cxx11::string::string(local_210,(string *)&step->PresetName);
                  pcVar15 = (cmake *)local_270;
                  __l_02._M_len = 4;
                  __l_02._M_array = (iterator)pcVar15;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_2d0,__l_02,&local_2e1);
                  BuildWorkflowStep((function<int_()> *)&args,pcVar15,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_2d0);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_2b8,&step->PresetName,
                             (function<int_()> *)&args);
                  std::_Function_base::~_Function_base((_Function_base *)&args);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_2d0);
                  lVar14 = 0x60;
                  do {
                    std::__cxx11::string::~string((string *)(local_270 + lVar14));
                    lVar14 = lVar14 + -0x20;
                    pWVar13 = local_2e0;
                  } while (lVar14 != -0x20);
                  break;
                case Test:
                  type_00.super_string_view._M_str = "test";
                  type_00.super_string_view._M_len = 4;
                  pTVar8 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                     (this,type_00,&settingsFile.TestPresets,step);
                  uVar2 = local_2d8;
                  if (pTVar8 == (TestPreset *)0x0) goto LAB_001e5820;
                  local_2b8.super_string_view._M_len = 4;
                  local_2b8.super_string_view._M_str = "test";
                  psVar4 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_270,(string *)psVar4);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_250,"--preset",&local_30d);
                  std::__cxx11::string::string(local_230,(string *)&step->PresetName);
                  pcVar15 = (cmake *)local_270;
                  __l_00._M_len = 3;
                  __l_00._M_array = (iterator)pcVar15;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_2d0,__l_00,&local_30e);
                  BuildWorkflowStep((function<int_()> *)&args,pcVar15,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_2d0);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_2b8,&step->PresetName,
                             (function<int_()> *)&args);
                  std::_Function_base::~_Function_base((_Function_base *)&args);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_2d0);
                  lVar14 = 0x40;
                  do {
                    std::__cxx11::string::~string((string *)(local_270 + lVar14));
                    lVar14 = lVar14 + -0x20;
                    pWVar13 = local_2e0;
                  } while (lVar14 != -0x20);
                  break;
                case Package:
                  type_01.super_string_view._M_str = "package";
                  type_01.super_string_view._M_len = 7;
                  pPVar9 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                     (this,type_01,&settingsFile.PackagePresets,step);
                  uVar2 = local_2d8;
                  if (pPVar9 == (PackagePreset *)0x0) goto LAB_001e5820;
                  local_2b8.super_string_view._M_len = 7;
                  local_2b8.super_string_view._M_str = "package";
                  psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_270,(string *)psVar4);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_250,"--preset",&local_30d);
                  std::__cxx11::string::string(local_230,(string *)&step->PresetName);
                  pcVar15 = (cmake *)local_270;
                  __l_01._M_len = 3;
                  __l_01._M_array = (iterator)pcVar15;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_2d0,__l_01,&local_30e);
                  BuildWorkflowStep((function<int_()> *)&args,pcVar15,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_2d0);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_2b8,&step->PresetName,
                             (function<int_()> *)&args);
                  std::_Function_base::~_Function_base((_Function_base *)&args);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_2d0);
                  lVar14 = 0x40;
                  do {
                    std::__cxx11::string::~string((string *)(local_270 + lVar14));
                    lVar14 = lVar14 + -0x20;
                    pWVar13 = local_2e0;
                  } while (lVar14 != -0x20);
                }
                stepNumber = stepNumber + 1;
              }
              bVar12 = true;
              pCVar16 = steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                if (pCVar16 == pCVar6) {
                  local_2d8 = 0;
                  uVar2 = local_2d8;
                  break;
                }
                if (!bVar12) {
                  std::operator<<((ostream *)&std::cout,"\n");
                }
                poVar11 = std::operator<<((ostream *)&std::cout,"Executing workflow step ");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,pCVar16->StepNumber);
                poVar11 = std::operator<<(poVar11," of ");
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                poVar11 = std::operator<<(poVar11,": ");
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(pCVar16->Type).super_string_view._M_str,
                                     (pCVar16->Type).super_string_view._M_len);
                poVar11 = std::operator<<(poVar11," preset \"");
                poVar11 = std::operator<<(poVar11,(string *)&pCVar16->Name);
                std::operator<<(poVar11,"\"\n\n");
                std::ostream::flush();
                iVar3 = std::function<int_()>::operator()(&pCVar16->Action);
                pCVar16 = pCVar16 + 1;
                bVar12 = false;
                uVar2 = CONCAT44(extraout_var,iVar3);
              } while (iVar3 == 0);
LAB_001e5820:
              local_2d8 = uVar2;
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector(&steps);
              goto LAB_001e582a;
            }
            local_270._0_8_ = (pointer)0x27;
            local_270._8_8_ = "Cannot use disabled workflow preset in ";
            psVar4 = GetHomeDirectory_abi_cxx11_(this);
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar4->_M_dataplus)._M_p;
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar4->_M_string_length;
            local_2d0.super_string_view._M_len =
                 CONCAT71(local_2d0.super_string_view._M_len._1_7_,0x22);
            cmStrCat<char[4],std::__cxx11::string,char>
                      ((string *)&steps,(cmAlphaNum *)local_270,(cmAlphaNum *)&args,
                       (char (*) [4])0x67336c,presetName,(char *)&local_2d0);
            cmSystemTools::Error((string *)&steps);
          }
          std::__cxx11::string::~string((string *)&steps);
          cmCMakePresetsGraph::PrintWorkflowPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
          goto LAB_001e582a;
        }
        local_270._0_8_ = (pointer)0x25;
        local_270._8_8_ = "Cannot use hidden workflow preset in ";
        psVar4 = GetHomeDirectory_abi_cxx11_(this);
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar4->_M_dataplus)._M_p;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar4->_M_string_length;
        local_2d0.super_string_view._M_len = CONCAT71(local_2d0.super_string_view._M_len._1_7_,0x22)
        ;
        cmStrCat<char[4],std::__cxx11::string,char>
                  ((string *)&steps,(cmAlphaNum *)local_270,(cmAlphaNum *)&args,
                   (char (*) [4])0x67336c,presetName,(char *)&local_2d0);
        cmSystemTools::Error((string *)&steps);
      }
      std::__cxx11::string::~string((string *)&steps);
      cmCMakePresetsGraph::PrintWorkflowPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
    }
  }
  else {
    local_270._0_8_ = (pointer)0x1c;
    local_270._8_8_ = "Could not read presets from ";
    psVar4 = GetHomeDirectory_abi_cxx11_(this);
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar4->_M_dataplus)._M_p;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar4->_M_string_length;
    local_2d0.super_string_view._M_len = (size_t)cmCMakePresetsGraph::ResultToString(result);
    cmStrCat<char[3],char_const*>
              ((string *)&steps,(cmAlphaNum *)local_270,(cmAlphaNum *)&args,(char (*) [3])0x65d8d7,
               (char **)&local_2d0);
    cmSystemTools::Error((string *)&steps);
    std::__cxx11::string::~string((string *)&steps);
  }
LAB_001e582a:
  cmCMakePresetsGraph::~cmCMakePresetsGraph(&settingsFile);
  return (int)local_2d8;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
    cmSystemTools::Error(
      cmStrCat("Could not read presets from ", this->GetHomeDirectory(), ": ",
               cmCMakePresetsGraph::ResultToString(result)));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}